

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

int ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar12;
  ulong uVar8;
  ulong uVar9;
  Mat *pMVar10;
  undefined8 uVar11;
  undefined1 auVar13 [32];
  undefined4 uVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  float fVar18;
  int iVar19;
  int *piVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  Mat *top_blob_00;
  long lVar31;
  long lVar32;
  void *pvVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  float *pfVar37;
  int iVar38;
  undefined8 *puVar39;
  undefined8 *puVar40;
  float *pfVar41;
  float *pfVar42;
  long lVar43;
  bool bVar44;
  int K;
  int iVar45;
  uint uVar46;
  undefined1 (*pauVar47) [16];
  Allocator **ppAVar48;
  uint N;
  int iVar49;
  uint uVar50;
  undefined1 (*pauVar51) [32];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  int TILE_K;
  Mat m;
  int TILE_N;
  int TILE_M;
  float tmp [2] [4] [8];
  Allocator *_allocator;
  uint local_324;
  ulong local_310;
  int local_2cc;
  ulong local_2c8;
  Mat local_2c0;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  long local_250;
  void *local_248;
  long local_240;
  uint local_238;
  uint local_234;
  int local_230;
  int local_22c;
  uint local_228;
  uint local_224;
  Mat local_220;
  ulong local_1d8;
  Mat local_1d0;
  ulong local_188;
  Mat *local_180;
  void *local_178;
  ulong local_170;
  long local_168;
  undefined1 local_160 [16];
  ulong uStack_150;
  int iStack_148;
  Allocator *local_140;
  int iStack_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  size_t local_120 [8];
  float local_e0 [44];
  undefined1 auVar67 [32];
  
  uVar7 = top_blob->w;
  uVar12 = top_blob->h;
  auVar56._4_4_ = uVar12;
  auVar56._0_4_ = uVar7;
  auVar53 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar56._8_8_ = 0;
  auVar53 = vpsubd_avx(auVar56,auVar53);
  auVar56 = vpsrld_avx(auVar53,0x1f);
  auVar53 = vpaddd_avx(auVar53,auVar56);
  auVar53 = vpsrad_avx(auVar53,1);
  uVar46 = top_blob->elempack * top_blob->c;
  N = auVar53._4_4_ * auVar53._0_4_;
  K = bottom_blob->elempack * bottom_blob->c;
  local_180 = bias;
  get_optimal_tile_mnk(uVar46,N,K,(int *)&local_224,(int *)&local_228,&local_2cc,nT);
  uVar27 = local_228;
  iVar24 = local_2cc;
  uVar22 = (int)(local_224 + uVar46 + -1) / (int)local_224;
  iVar49 = (int)(N + local_228 + -1) / (int)local_228;
  iVar23 = (K + local_2cc + -1) / local_2cc;
  iVar35 = local_2cc * local_228;
  _allocator = opt->workspace_allocator;
  local_220.cstep = 0;
  local_220.data = (void *)0x0;
  local_220.refcount._0_4_ = 0;
  local_220.refcount._4_4_ = 0;
  local_220.elemsize = 0;
  local_220.elempack = 0;
  local_220.allocator = (Allocator *)0x0;
  local_220.dims = 0;
  local_220.w = 0;
  local_220.h = 0;
  local_220.d = 0;
  local_220.c = 0;
  local_188 = (ulong)uVar46;
  Mat::create(&local_220,iVar35,0x10,iVar23,iVar49,4,_allocator);
  iVar28 = -100;
  if ((local_220.data == (void *)0x0) || ((long)local_220.c * local_220.cstep == 0))
  goto LAB_0020f07d;
  iVar49 = iVar49 * iVar23;
  iVar35 = iVar35 * 0x10;
  if ((nT < 2) || (nT <= iVar49)) {
    local_120[0] = 0;
    local_160._0_8_ = (Allocator *)0x0;
    local_160._8_4_ = 0;
    local_160._12_4_ = 0;
    uStack_150 = 0;
    iStack_148 = 0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    iStack_130 = 0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar35,1,nT,4,opt->workspace_allocator);
    if (((Allocator *)local_160._0_8_ == (Allocator *)0x0) || ((long)iStack_128 * local_120[0] == 0)
       ) {
      piVar20 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
      iVar28 = -100;
      if (piVar20 == (int *)0x0) goto LAB_0020f07d;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_0020f07d;
      if (local_140 != (Allocator *)0x0) {
        (*local_140->_vptr_Allocator[3])();
        goto LAB_0020f07d;
      }
      goto LAB_0020e0bc;
    }
    if (0 < iVar49) {
      iVar35 = 0;
      do {
        iVar28 = uVar27 * (iVar35 / iVar23);
        iVar38 = iVar24 * (iVar35 % iVar23);
        uVar46 = N - iVar28;
        if ((int)uVar27 < (int)uVar46) {
          uVar46 = uVar27;
        }
        iVar45 = K - iVar38;
        if (iVar24 < iVar45) {
          iVar45 = iVar24;
        }
        iVar25 = get_omp_thread_num();
        local_2c0.data =
             (void *)((long)(_func_int ***)local_160._0_8_ +
                     (long)iVar25 * local_120[0] * uStack_150);
        local_2c0.refcount._0_4_ = 0;
        local_2c0.refcount._4_4_ = 0;
        local_2c0.elemsize = uStack_150;
        local_2c0.elempack = iStack_148;
        local_2c0.allocator = local_140;
        local_2c0.w = iStack_134;
        local_2c0.h = iStack_130;
        local_2c0.d = 1;
        local_2c0.c = iStack_12c;
        local_2c0.dims = iStack_138 + -1;
        local_2c0.cstep =
             (uStack_150 * (long)iStack_130 * (long)iStack_134 + 0xf & 0xfffffffffffffff0) /
             uStack_150;
        if (iStack_138 == 4) {
          local_2c0.cstep = (long)iStack_130 * (long)iStack_134;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (bottom_blob,&local_2c0,iVar28,uVar46,iVar38,iVar45,(int)_allocator);
        local_1d0.cstep = (long)local_220.h * (long)local_220.w;
        local_1d0.data =
             (void *)((long)local_220.data +
                     (uint)(iVar35 % iVar23) * local_220.elemsize * local_1d0.cstep +
                     (long)(iVar35 / iVar23) * local_220.cstep * local_220.elemsize);
        local_1d0.refcount = (int *)0x0;
        local_1d0.elemsize = local_220.elemsize;
        local_1d0.elempack = local_220.elempack;
        local_1d0.allocator = local_220.allocator;
        local_1d0.dims = 2;
        local_1d0.w = local_220.w;
        local_1d0.h = local_220.h;
        local_1d0.d = 1;
        local_1d0.c = 1;
        transpose_pack_B_tile(&local_2c0,&local_1d0,0x10,uVar46,iVar45,(int)local_1d0.cstep);
        iVar35 = iVar35 + 1;
      } while (iVar49 != iVar35);
    }
    piVar20 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_140 == (Allocator *)0x0) goto LAB_0020e0d2;
        (*local_140->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_120[0] = 0;
    local_160._0_8_ = (Allocator *)0x0;
    local_160._8_4_ = 0;
    local_160._12_4_ = 0;
    uStack_150 = 0;
    iStack_148 = 0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    iStack_130 = 0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar35,4,opt->workspace_allocator);
    if (((Allocator *)local_160._0_8_ == (Allocator *)0x0) || ((long)iStack_128 * local_120[0] == 0)
       ) {
      piVar20 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
      iVar28 = -100;
      if (piVar20 == (int *)0x0) goto LAB_0020f07d;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_0020f07d;
      if (local_140 != (Allocator *)0x0) {
        (*local_140->_vptr_Allocator[3])();
        goto LAB_0020f07d;
      }
LAB_0020e0bc:
      iVar28 = -100;
      if ((Allocator *)local_160._0_8_ != (Allocator *)0x0) {
        free((void *)local_160._0_8_);
      }
      goto LAB_0020f07d;
    }
    if (0 < iVar49) {
      iVar35 = 0;
      do {
        iVar28 = uVar27 * (iVar35 / iVar23);
        iVar38 = iVar24 * (int)((long)iVar35 % (long)iVar23);
        uVar46 = N - iVar28;
        if ((int)uVar27 < (int)uVar46) {
          uVar46 = uVar27;
        }
        iVar45 = K - iVar38;
        if (iVar24 < iVar45) {
          iVar45 = iVar24;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (bottom_blob,(Mat *)local_160,iVar28,uVar46,iVar38,iVar45,(int)_allocator);
        local_2c0.cstep = (long)local_220.h * (long)local_220.w;
        local_2c0.data =
             (void *)((long)local_220.data +
                     ((long)iVar35 % (long)iVar23 & 0xffffffffU) * local_220.elemsize *
                     local_2c0.cstep +
                     (long)(iVar35 / iVar23) * local_220.cstep * local_220.elemsize);
        local_2c0.refcount._0_4_ = 0;
        local_2c0.refcount._4_4_ = 0;
        local_2c0.elemsize = local_220.elemsize;
        local_2c0.elempack = local_220.elempack;
        local_2c0.allocator = local_220.allocator;
        local_2c0.dims = 2;
        local_2c0.w = local_220.w;
        local_2c0.h = local_220.h;
        local_2c0.d = 1;
        local_2c0.c = 1;
        transpose_pack_B_tile((Mat *)local_160,&local_2c0,0x10,uVar46,iVar45,(int)local_2c0.cstep);
        iVar35 = iVar35 + 1;
      } while (iVar49 != iVar35);
    }
    piVar20 = (int *)CONCAT44(local_160._12_4_,local_160._8_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_140 == (Allocator *)0x0) {
LAB_0020e0d2:
          if ((Allocator *)local_160._0_8_ != (Allocator *)0x0) {
            free((void *)local_160._0_8_);
          }
        }
        else {
          (*local_140->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_238 = local_224;
  local_2c0.cstep = 0;
  local_2c0.data = (_func_int ***)0x0;
  local_2c0.refcount._0_4_ = 0;
  local_2c0.refcount._4_4_ = 0;
  local_2c0.elemsize = 0;
  local_2c0.elempack = 0;
  local_2c0.allocator = (Allocator *)0x0;
  local_2c0.dims = 0;
  local_2c0.w = 0;
  local_2c0.h = 0;
  local_2c0.d = 0;
  local_2c0.c = 0;
  Mat::create(&local_2c0,local_228 * local_224 * 0x10,1,nT,4,opt->workspace_allocator);
  iVar28 = -100;
  if (((_func_int ***)local_2c0.data != (_func_int ***)0x0) &&
     ((long)local_2c0.c * local_2c0.cstep != 0)) {
    if (0 < (int)uVar22) {
      local_324 = 0;
      do {
        iVar24 = get_omp_thread_num();
        uVar46 = local_238 * local_324;
        local_268 = (ulong)uVar46;
        uVar27 = (int)local_188 - uVar46;
        if ((int)local_238 < (int)uVar27) {
          uVar27 = local_238;
        }
        if (0 < (int)N) {
          top_blob_00 = (Mat *)((long)local_2c0.data +
                               (long)iVar24 * local_2c0.cstep * local_2c0.elemsize);
          lVar26 = (long)(int)uVar46;
          local_170 = (ulong)uVar27;
          local_250 = (long)(int)uVar27;
          local_260 = (ulong)local_324;
          iVar24 = 0;
          uVar46 = N;
          do {
            local_234 = uVar46;
            iVar23 = local_2cc;
            uVar46 = local_234;
            if ((int)local_228 < (int)local_234) {
              uVar46 = local_228;
            }
            local_2c8 = (ulong)uVar46;
            local_168 = (long)(int)local_234;
            if ((long)(int)local_228 < (long)(int)local_234) {
              local_168 = (long)(int)local_228;
            }
            uVar46 = N - iVar24;
            if ((int)local_228 < (int)(N - iVar24)) {
              uVar46 = local_228;
            }
            if (0 < K) {
              iVar28 = 0;
              iVar35 = K;
              do {
                iVar49 = iVar35;
                if (iVar23 < iVar35) {
                  iVar49 = iVar23;
                }
                iStack_134 = AT->w;
                iStack_130 = AT->h;
                uStack_150 = AT->elemsize;
                iStack_148 = AT->elempack;
                local_140 = AT->allocator;
                local_120[0] = (long)iStack_130 * (long)iStack_134;
                local_160._0_8_ =
                     (long)AT->data +
                     uStack_150 * local_120[0] * (long)(iVar28 / iVar23) +
                     AT->cstep * local_260 * uStack_150;
                local_160._8_4_ = 0;
                local_160._12_4_ = 0;
                iStack_138 = 2;
                iStack_12c = 1;
                iStack_128 = 1;
                local_1d0.cstep = (long)local_220.h * (long)local_220.w;
                local_1d0.data =
                     (void *)((long)local_220.data +
                             local_220.elemsize * local_1d0.cstep * (long)(iVar28 / iVar23) +
                             local_220.cstep * (long)(iVar24 / (int)local_228) * local_220.elemsize)
                ;
                local_1d0.refcount = (int *)0x0;
                local_1d0.elemsize = local_220.elemsize;
                local_1d0.elempack = local_220.elempack;
                local_1d0.allocator = local_220.allocator;
                local_1d0.dims = 2;
                local_1d0.w = local_220.w;
                local_1d0.h = local_220.h;
                local_1d0.d = 1;
                local_1d0.c = 1;
                iVar35 = -(iVar23 - iVar35);
                gemm_transB_packed_tile
                          ((Mat *)local_160,&local_1d0,top_blob_00,0x10,uVar27,uVar46,iVar28,iVar49)
                ;
                iVar28 = iVar28 + iVar23;
              } while (iVar28 < K);
            }
            iVar38 = (int)local_2c8;
            local_22c = iVar38 * 0x10;
            lVar43 = (long)(iVar38 * 8);
            iVar23 = top_blob->w;
            iVar35 = top_blob->elempack;
            iVar28 = top_blob->h;
            uVar29 = (int)top_blob->cstep * iVar35;
            local_270 = (ulong)uVar29;
            iVar49 = (iVar23 - (iVar23 + 1 >> 0x1f)) + 1 >> 1;
            uVar34 = 0;
            pvVar15 = local_180->data;
            if (7 < (int)uVar27) {
              local_230 = iVar38 * 0x80;
              local_178 = (void *)((long)pvVar15 + lVar26 * 4);
              lVar31 = (long)(int)uVar29;
              local_248 = (void *)(ulong)uVar46;
              local_258 = 0;
              uVar34 = 0;
              do {
                local_1d8 = uVar34;
                if (pvVar15 == (void *)0x0) {
                  auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                else {
                  auVar54 = *(undefined1 (*) [32])((long)local_178 + local_1d8 * 4);
                }
                if (0 < (int)uVar46) {
                  pfVar41 = (float *)((long)&top_blob_00->data + (long)(int)local_258 * 4);
                  local_240 = (long)(((int)local_268 + (int)local_1d8) / iVar35);
                  pvVar33 = (void *)0x0;
                  do {
                    iVar45 = iVar24 + (int)pvVar33;
                    lVar32 = 0x80;
                    pfVar37 = pfVar41;
                    do {
                      auVar13 = *(undefined1 (*) [32])(pfVar37 + lVar43);
                      auVar60 = *(undefined1 (*) [32])(pfVar37 + local_22c);
                      auVar70._0_4_ = auVar13._0_4_ + *pfVar37 + auVar60._0_4_;
                      auVar70._4_4_ = auVar13._4_4_ + pfVar37[1] + auVar60._4_4_;
                      auVar70._8_4_ = auVar13._8_4_ + pfVar37[2] + auVar60._8_4_;
                      auVar70._12_4_ = auVar13._12_4_ + pfVar37[3] + auVar60._12_4_;
                      auVar70._16_4_ = auVar13._16_4_ + pfVar37[4] + auVar60._16_4_;
                      auVar70._20_4_ = auVar13._20_4_ + pfVar37[5] + auVar60._20_4_;
                      auVar70._24_4_ = auVar13._24_4_ + pfVar37[6] + auVar60._24_4_;
                      auVar70._28_4_ = auVar13._28_4_ + pfVar37[7] + auVar60._28_4_;
                      auVar13 = vsubps_avx(auVar13,auVar60);
                      pfVar42 = pfVar37 + iVar38 * 0x18;
                      auVar60._0_4_ = auVar13._0_4_ + *pfVar42;
                      auVar60._4_4_ = auVar13._4_4_ + pfVar42[1];
                      auVar60._8_4_ = auVar13._8_4_ + pfVar42[2];
                      auVar60._12_4_ = auVar13._12_4_ + pfVar42[3];
                      auVar60._16_4_ = auVar13._16_4_ + pfVar42[4];
                      auVar60._20_4_ = auVar13._20_4_ + pfVar42[5];
                      auVar60._24_4_ = auVar13._24_4_ + pfVar42[6];
                      auVar60._28_4_ = auVar13._28_4_ + pfVar42[7];
                      *(undefined1 (*) [32])((long)&local_220.cstep + lVar32) = auVar70;
                      *(undefined1 (*) [32])(local_160 + lVar32) = auVar60;
                      lVar32 = lVar32 + 0x20;
                      pfVar37 = pfVar37 + iVar38 * 0x20;
                    } while (lVar32 != 0x100);
                    iVar25 = iVar45 % iVar49;
                    uVar30 = (iVar45 / iVar49) * 2;
                    pauVar51 = (undefined1 (*) [32])
                               ((long)top_blob->data +
                               (long)(iVar25 * 2 * iVar35) * 4 +
                               (long)top_blob->w * top_blob->elemsize * (long)(int)uVar30 +
                               top_blob->cstep * local_240 * top_blob->elemsize);
                    iVar45 = iVar25 * 2 + 1;
                    uVar50 = 0;
                    pfVar37 = (float *)local_160;
                    bVar21 = true;
                    do {
                      bVar44 = bVar21;
                      if ((int)(uVar50 | uVar30) < iVar28) {
                        auVar61._0_4_ = auVar54._0_4_ + pfVar37[8];
                        auVar61._4_4_ = auVar54._4_4_ + pfVar37[9];
                        auVar61._8_4_ = auVar54._8_4_ + pfVar37[10];
                        auVar61._12_4_ = auVar54._12_4_ + pfVar37[0xb];
                        auVar61._16_4_ = auVar54._16_4_ + pfVar37[0xc];
                        auVar61._20_4_ = auVar54._20_4_ + pfVar37[0xd];
                        auVar61._24_4_ = auVar54._24_4_ + pfVar37[0xe];
                        auVar61._28_4_ = auVar54._28_4_ + pfVar37[0xf];
                        auVar13 = *(undefined1 (*) [32])(pfVar37 + 0x10);
                        auVar63._0_4_ = auVar61._0_4_ + *pfVar37 + auVar13._0_4_;
                        auVar63._4_4_ = auVar61._4_4_ + pfVar37[1] + auVar13._4_4_;
                        auVar63._8_4_ = auVar61._8_4_ + pfVar37[2] + auVar13._8_4_;
                        auVar63._12_4_ = auVar61._12_4_ + pfVar37[3] + auVar13._12_4_;
                        auVar67._16_4_ = auVar61._16_4_ + pfVar37[4] + auVar13._16_4_;
                        auVar67._0_16_ = auVar63;
                        auVar67._20_4_ = auVar61._20_4_ + pfVar37[5] + auVar13._20_4_;
                        auVar67._24_4_ = auVar61._24_4_ + pfVar37[6] + auVar13._24_4_;
                        auVar67._28_4_ = auVar61._28_4_ + pfVar37[7] + auVar13._28_4_;
                        auVar13 = vsubps_avx(auVar61,auVar13);
                        auVar53._0_4_ = auVar13._0_4_ + pfVar37[0x18];
                        auVar53._4_4_ = auVar13._4_4_ + pfVar37[0x19];
                        auVar53._8_4_ = auVar13._8_4_ + pfVar37[0x1a];
                        auVar53._12_4_ = auVar13._12_4_ + pfVar37[0x1b];
                        auVar62._16_4_ = auVar13._16_4_ + pfVar37[0x1c];
                        auVar62._0_16_ = auVar53;
                        auVar62._20_4_ = auVar13._20_4_ + pfVar37[0x1d];
                        auVar62._24_4_ = auVar13._24_4_ + pfVar37[0x1e];
                        auVar62._28_4_ = auVar13._28_4_ + pfVar37[0x1f];
                        auVar57 = auVar67._16_16_;
                        auVar56 = auVar62._16_16_;
                        if (iVar35 == 1) {
                          *(float *)*pauVar51 = auVar63._0_4_;
                          uVar14 = vextractps_avx(auVar63,1);
                          *(undefined4 *)(*pauVar51 + lVar31 * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar63,2);
                          *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 2) * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar63,3);
                          *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 3) * 4) = uVar14;
                          *(float *)(*pauVar51 + (long)(int)(uVar29 * 4) * 4) = auVar67._16_4_;
                          uVar14 = vextractps_avx(auVar57,1);
                          *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 5) * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar57,2);
                          *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 6) * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar57,3);
                          *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 7) * 4) = uVar14;
                          if (iVar45 < iVar23) {
                            *(float *)(*pauVar51 + 4) = auVar53._0_4_;
                            uVar14 = vextractps_avx(auVar53,1);
                            *(undefined4 *)(*pauVar51 + lVar31 * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar53,2);
                            *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 2) * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar53,3);
                            *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 3) * 4 + 4) = uVar14;
                            *(float *)(*pauVar51 + (long)(int)(uVar29 * 4) * 4 + 4) = auVar62._16_4_
                            ;
                            uVar14 = vextractps_avx(auVar56,1);
                            *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 5) * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar56,2);
                            *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 6) * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar56,3);
                            *(undefined4 *)(*pauVar51 + (long)(int)(uVar29 * 7) * 4 + 4) = uVar14;
                          }
                        }
                        else if (iVar35 == 4) {
                          *(undefined1 (*) [16])*pauVar51 = auVar63;
                          *(undefined1 (*) [16])(*pauVar51 + lVar31 * 4) = auVar57;
                          if (iVar45 < iVar23) {
                            *(undefined1 (*) [16])(*pauVar51 + 0x10) = auVar53;
                            *(undefined1 (*) [16])(*pauVar51 + lVar31 * 4 + 0x10) = auVar56;
                          }
                        }
                        else if ((iVar35 == 8) && (*pauVar51 = auVar67, iVar45 < iVar23)) {
                          pauVar51[1] = auVar62;
                        }
                        pauVar51 = (undefined1 (*) [32])(*pauVar51 + (long)(iVar35 * iVar23) * 4);
                      }
                      uVar50 = 1;
                      pfVar37 = local_e0;
                      bVar21 = false;
                    } while (bVar44);
                    pvVar33 = (void *)((long)pvVar33 + 1);
                    pfVar41 = pfVar41 + 8;
                  } while (pvVar33 != local_248);
                }
                uVar34 = local_1d8 + 8;
                local_258 = (ulong)(uint)((int)local_258 + local_230);
              } while (local_1d8 + 0xf < local_170);
            }
            lVar31 = (long)(iVar38 * 4);
            if ((int)((uint)uVar34 | 3) < (int)uVar27) {
              local_240 = CONCAT44(local_240._4_4_,iVar38 * 0x40);
              local_248 = (void *)((long)pvVar15 + lVar26 * 4);
              iVar45 = (uint)uVar34 * iVar38 * 0x10;
              local_310 = uVar34 & 0xffffffff;
              do {
                if (pvVar15 == (void *)0x0) {
                  auVar53 = (undefined1  [16])0x0;
                }
                else {
                  auVar53 = *(undefined1 (*) [16])((long)local_248 + local_310 * 4);
                }
                if (0 < (int)uVar46) {
                  pfVar41 = (float *)((long)&top_blob_00->data + (long)iVar45 * 4);
                  uVar34 = 0;
                  do {
                    iVar25 = iVar24 + (int)uVar34;
                    lVar32 = 0x40;
                    pfVar37 = pfVar41;
                    do {
                      auVar56 = *(undefined1 (*) [16])(pfVar37 + lVar31);
                      auVar63 = *(undefined1 (*) [16])(pfVar37 + lVar43);
                      auVar68._0_4_ = auVar56._0_4_ + *pfVar37 + auVar63._0_4_;
                      auVar68._4_4_ = auVar56._4_4_ + pfVar37[1] + auVar63._4_4_;
                      auVar68._8_4_ = auVar56._8_4_ + pfVar37[2] + auVar63._8_4_;
                      auVar68._12_4_ = auVar56._12_4_ + pfVar37[3] + auVar63._12_4_;
                      auVar56 = vsubps_avx(auVar56,auVar63);
                      pfVar42 = pfVar37 + iVar38 * 0xc;
                      auVar57._0_4_ = auVar56._0_4_ + *pfVar42;
                      auVar57._4_4_ = auVar56._4_4_ + pfVar42[1];
                      auVar57._8_4_ = auVar56._8_4_ + pfVar42[2];
                      auVar57._12_4_ = auVar56._12_4_ + pfVar42[3];
                      *(undefined1 (*) [16])((long)&local_1d0.h + lVar32) = auVar68;
                      *(undefined1 (*) [16])(local_160 + lVar32) = auVar57;
                      lVar32 = lVar32 + 0x10;
                      pfVar37 = pfVar37 + local_22c;
                    } while (lVar32 != 0x80);
                    iVar19 = iVar25 % iVar49;
                    uVar30 = (iVar25 / iVar49) * 2;
                    pauVar47 = (undefined1 (*) [16])
                               ((long)top_blob->data +
                               (long)(iVar19 * 2 * iVar35) * 4 +
                               (long)top_blob->w * top_blob->elemsize * (long)(int)uVar30 +
                               top_blob->cstep * (long)(((int)local_268 + (int)local_310) / iVar35)
                               * top_blob->elemsize);
                    iVar25 = iVar19 * 2 + 1;
                    uVar50 = 0;
                    pfVar37 = (float *)local_160;
                    bVar21 = true;
                    do {
                      bVar44 = bVar21;
                      if ((int)(uVar50 | uVar30) < iVar28) {
                        auVar58._0_4_ = auVar53._0_4_ + pfVar37[4];
                        auVar58._4_4_ = auVar53._4_4_ + pfVar37[5];
                        auVar58._8_4_ = auVar53._8_4_ + pfVar37[6];
                        auVar58._12_4_ = auVar53._12_4_ + pfVar37[7];
                        auVar56 = *(undefined1 (*) [16])(pfVar37 + 8);
                        auVar64._0_4_ = auVar58._0_4_ + *pfVar37 + auVar56._0_4_;
                        auVar64._4_4_ = auVar58._4_4_ + pfVar37[1] + auVar56._4_4_;
                        auVar64._8_4_ = auVar58._8_4_ + pfVar37[2] + auVar56._8_4_;
                        auVar64._12_4_ = auVar58._12_4_ + pfVar37[3] + auVar56._12_4_;
                        auVar56 = vsubps_avx(auVar58,auVar56);
                        auVar59._0_4_ = auVar56._0_4_ + pfVar37[0xc];
                        auVar59._4_4_ = auVar56._4_4_ + pfVar37[0xd];
                        auVar59._8_4_ = auVar56._8_4_ + pfVar37[0xe];
                        auVar59._12_4_ = auVar56._12_4_ + pfVar37[0xf];
                        if (iVar35 == 1) {
                          *(float *)*pauVar47 = auVar64._0_4_;
                          uVar14 = vextractps_avx(auVar64,1);
                          *(undefined4 *)(*pauVar47 + (long)(int)uVar29 * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar64,2);
                          *(undefined4 *)(*pauVar47 + (long)(int)(uVar29 * 2) * 4) = uVar14;
                          uVar14 = vextractps_avx(auVar64,3);
                          *(undefined4 *)(*pauVar47 + (long)(int)(uVar29 * 3) * 4) = uVar14;
                          if (iVar25 < iVar23) {
                            *(float *)(*pauVar47 + 4) = auVar59._0_4_;
                            uVar14 = vextractps_avx(auVar59,1);
                            *(undefined4 *)(*pauVar47 + (long)(int)uVar29 * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar59,2);
                            *(undefined4 *)(*pauVar47 + (long)(int)(uVar29 * 2) * 4 + 4) = uVar14;
                            uVar14 = vextractps_avx(auVar59,3);
                            *(undefined4 *)(*pauVar47 + (long)(int)(uVar29 * 3) * 4 + 4) = uVar14;
                          }
                        }
                        else if ((iVar35 == 4) && (*pauVar47 = auVar64, iVar25 < iVar23)) {
                          pauVar47[1] = auVar59;
                        }
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + (long)(iVar35 * iVar23) * 4);
                      }
                      uVar50 = 1;
                      pfVar37 = (float *)local_120;
                      bVar21 = false;
                    } while (bVar44);
                    uVar34 = uVar34 + 1;
                    pfVar41 = pfVar41 + 4;
                  } while (uVar34 != uVar46);
                }
                uVar34 = local_310 + 4;
                lVar32 = local_310 + 7;
                iVar45 = iVar45 + iVar38 * 0x40;
                local_310 = uVar34;
              } while (lVar32 < local_250);
              uVar34 = uVar34 & 0xffffffff;
            }
            uVar30 = (uint)uVar34;
            if ((int)(uVar30 | 1) < (int)uVar27) {
              iVar35 = top_blob->w;
              pvVar33 = top_blob->data;
              sVar16 = top_blob->elemsize;
              sVar17 = top_blob->cstep;
              iVar45 = uVar30 * iVar38 * 0x10;
              uVar34 = uVar34 & 0xffffffff;
              do {
                if (pvVar15 == (void *)0x0) {
                  fVar52 = 0.0;
                  fVar55 = 0.0;
                }
                else {
                  fVar52 = *(float *)((long)pvVar15 + (lVar26 + uVar34) * 4);
                  fVar55 = *(float *)((long)pvVar15 + (lVar26 + uVar34) * 4 + 4);
                }
                if (0 < (int)uVar46) {
                  puVar39 = (undefined8 *)((long)&top_blob_00->data + (long)iVar45 * 4);
                  uVar36 = 0;
                  do {
                    iVar25 = iVar24 + (int)uVar36;
                    lVar32 = 4;
                    puVar40 = puVar39;
                    do {
                      uVar8 = *(ulong *)((long)puVar40 + (long)(iVar38 * 2) * 4);
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = uVar8;
                      uVar9 = *(ulong *)((long)puVar40 + lVar31 * 4);
                      auVar71._8_8_ = 0;
                      auVar71._0_8_ = uVar9;
                      auVar65._0_4_ = (float)uVar8 + (float)*puVar40 + (float)uVar9;
                      auVar65._4_4_ =
                           (float)(uVar8 >> 0x20) + (float)((ulong)*puVar40 >> 0x20) +
                           (float)(uVar9 >> 0x20);
                      auVar65._8_8_ = 0;
                      pMVar10 = (Mat *)vmovlps_avx(auVar65);
                      (&local_180)[lVar32] = pMVar10;
                      auVar53 = vsubps_avx(auVar69,auVar71);
                      uVar11 = *(undefined8 *)((long)puVar40 + (long)(iVar38 * 6) * 4);
                      auVar66._0_4_ = auVar53._0_4_ + (float)uVar11;
                      auVar66._4_4_ = auVar53._4_4_ + (float)((ulong)uVar11 >> 0x20);
                      auVar66._8_4_ = auVar53._8_4_ + 0.0;
                      auVar66._12_4_ = auVar53._12_4_ + 0.0;
                      uVar11 = vmovlps_avx(auVar66);
                      *(undefined8 *)(local_160 + lVar32 * 8) = uVar11;
                      lVar32 = lVar32 + 1;
                      puVar40 = (undefined8 *)((long)puVar40 + lVar43 * 4);
                    } while (lVar32 != 8);
                    iVar19 = iVar25 % iVar49;
                    uVar30 = (iVar25 / iVar49) * 2;
                    pfVar41 = (float *)((long)pvVar33 +
                                       (long)(iVar19 * 2) * 4 +
                                       (long)(int)uVar30 * (long)iVar35 * sVar16 +
                                       (lVar26 + uVar34) * sVar17 * sVar16);
                    uVar50 = 0;
                    ppAVar48 = (Allocator **)local_160;
                    bVar21 = true;
                    do {
                      bVar44 = bVar21;
                      if ((int)(uVar50 | uVar30) < iVar28) {
                        fVar1 = *(float *)(ppAVar48 + 2);
                        fVar2 = *(float *)((long)ppAVar48 + 0x14);
                        fVar3 = *(float *)(ppAVar48 + 3);
                        fVar4 = *(float *)(ppAVar48 + 1);
                        fVar5 = *(float *)((long)ppAVar48 + 0x1c);
                        fVar18 = fVar55 + *(float *)((long)ppAVar48 + 0xc);
                        fVar6 = *(float *)((long)ppAVar48 + 4);
                        *pfVar41 = fVar52 + fVar4 + *(float *)ppAVar48 + fVar1;
                        pfVar41[(int)uVar29] = fVar18 + fVar6 + fVar2;
                        if (iVar19 * 2 + 1 < iVar23) {
                          pfVar41[1] = ((fVar52 + fVar4) - fVar1) + fVar3;
                          pfVar41[(long)(int)uVar29 + 1] = (fVar18 - fVar2) + fVar5;
                        }
                        pfVar41 = pfVar41 + iVar23;
                      }
                      uVar50 = 1;
                      ppAVar48 = &local_140;
                      bVar21 = false;
                    } while (bVar44);
                    uVar36 = uVar36 + 1;
                    puVar39 = puVar39 + 1;
                  } while (uVar36 != uVar46);
                }
                uVar36 = uVar34 + 2;
                lVar32 = uVar34 + 3;
                iVar45 = iVar45 + iVar38 * 0x20;
                uVar34 = uVar36;
              } while (lVar32 < local_250);
              uVar30 = (uint)uVar36;
            }
            if ((int)uVar30 < (int)uVar27) {
              iVar35 = top_blob->w;
              pvVar33 = top_blob->data;
              sVar16 = top_blob->elemsize;
              sVar17 = top_blob->cstep;
              lVar43 = (long)(int)uVar30;
              iVar45 = uVar30 * iVar38 * 0x10;
              do {
                if (pvVar15 == (void *)0x0) {
                  fVar52 = 0.0;
                }
                else {
                  fVar52 = *(float *)((long)pvVar15 + lVar43 * 4 + lVar26 * 4);
                }
                if (0 < (int)uVar46) {
                  pfVar41 = (float *)((long)&top_blob_00->data + (long)iVar45 * 4);
                  uVar34 = 0;
                  do {
                    iVar25 = iVar24 + (int)uVar34;
                    lVar32 = 4;
                    pfVar37 = pfVar41;
                    do {
                      fVar55 = pfVar37[local_168];
                      fVar1 = pfVar37[iVar38 * 2];
                      *(float *)((long)&local_170 + lVar32 * 4) = fVar55 + *pfVar37 + fVar1;
                      *(float *)(local_160 + lVar32 * 4) = (fVar55 - fVar1) + pfVar37[iVar38 * 3];
                      lVar32 = lVar32 + 1;
                      pfVar37 = pfVar37 + lVar31;
                    } while (lVar32 != 8);
                    iVar19 = iVar25 % iVar49;
                    uVar29 = (iVar25 / iVar49) * 2;
                    pfVar37 = (float *)((long)pvVar33 +
                                       (long)(iVar19 * 2) * 4 +
                                       (long)(int)uVar29 * (long)iVar35 * sVar16 +
                                       (lVar43 + lVar26) * sVar17 * sVar16);
                    uVar30 = 0;
                    pfVar42 = (float *)local_160;
                    bVar21 = true;
                    do {
                      bVar44 = bVar21;
                      if ((int)(uVar30 | uVar29) < iVar28) {
                        fVar55 = pfVar42[2];
                        fVar1 = pfVar42[1];
                        fVar2 = pfVar42[3];
                        *pfVar37 = fVar52 + fVar1 + *pfVar42 + fVar55;
                        if (iVar19 * 2 + 1 < iVar23) {
                          pfVar37[1] = ((fVar52 + fVar1) - fVar55) + fVar2;
                        }
                        pfVar37 = pfVar37 + iVar23;
                      }
                      uVar30 = 1;
                      pfVar42 = (float *)&uStack_150;
                      bVar21 = false;
                    } while (bVar44);
                    uVar34 = uVar34 + 1;
                    pfVar41 = pfVar41 + 1;
                  } while (uVar34 != uVar46);
                }
                lVar43 = lVar43 + 1;
                iVar45 = iVar45 + local_22c;
              } while (lVar43 != local_250);
            }
            iVar24 = iVar24 + local_228;
            uVar46 = local_234 - local_228;
          } while (iVar24 < (int)N);
        }
        local_324 = local_324 + 1;
      } while (local_324 != uVar22);
    }
    iVar28 = 0;
  }
  piVar20 = (int *)CONCAT44(local_2c0.refcount._4_4_,local_2c0.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_2c0.allocator == (Allocator *)0x0) {
        if ((_func_int ***)local_2c0.data != (_func_int ***)0x0) {
          free(local_2c0.data);
        }
      }
      else {
        (*(local_2c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0020f07d:
  piVar20 = (int *)CONCAT44(local_220.refcount._4_4_,local_220.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_220.allocator == (Allocator *)0x0) {
        if (local_220.data != (void *)0x0) {
          free(local_220.data);
        }
      }
      else {
        (*(local_220.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

static int conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}